

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O3

size_t fiobj_str_concat(FIOBJ dest,FIOBJ obj)

{
  byte bVar1;
  fiobj_object_vtable_s *pfVar2;
  uint uVar3;
  ulong uVar4;
  char cVar5;
  fio_str_info_s o;
  fio_str_info_s local_38;
  fio_str_info_s local_20;
  
  if (((uint)dest & 7) != 2) {
    __assert_fail("FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_str.c"
                  ,0x137,"size_t fiobj_str_concat(FIOBJ, FIOBJ)");
  }
  uVar4 = dest & 0xfffffffffffffff8;
  if (*(char *)(uVar4 + 0x11) != '\0') {
    return 0;
  }
  *(undefined8 *)(uVar4 + 8) = 0;
  if (obj == 0) {
LAB_001451b3:
    local_38.data = anon_var_dwarf_20c;
    local_38.len._0_4_ = 4;
    goto LAB_001451c6;
  }
  cVar5 = (char)obj;
  if ((obj & 1) != 0) {
    fio_ltocstr(&local_38,(long)obj >> 1);
    goto LAB_001451ca;
  }
  switch((uint)obj & 6) {
  case 0:
    cVar5 = *(char *)(obj & 0xfffffffffffffff8);
LAB_00145150:
    switch(cVar5) {
    case '\'':
      pfVar2 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      goto switchD_00145145_caseD_2;
    case ')':
      pfVar2 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      goto switchD_00145145_caseD_4;
    case '+':
      pfVar2 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar2 = &FIOBJECT_VTABLE_NUMBER;
    }
    break;
  case 2:
switchD_00145145_caseD_2:
    pfVar2 = &FIOBJECT_VTABLE_STRING;
    break;
  case 4:
switchD_00145145_caseD_4:
    pfVar2 = &FIOBJECT_VTABLE_HASH;
    break;
  case 6:
    if (cVar5 == '&') {
      local_38.data = anon_var_dwarf_217;
      local_38.len._0_4_ = 5;
    }
    else {
      uVar3 = (uint)obj & 0xff;
      if (uVar3 != 0x16) {
        if (uVar3 == 6) goto LAB_001451b3;
        goto LAB_00145150;
      }
      local_38.data = anon_var_dwarf_222;
      local_38.len._0_4_ = 4;
    }
LAB_001451c6:
    local_38.capa._0_4_ = 0;
    local_38.capa._4_4_ = 0;
    local_38.len._4_4_ = 0;
    goto LAB_001451ca;
  }
  (*pfVar2->to_str)(&local_38,obj);
LAB_001451ca:
  if (CONCAT44(local_38.len._4_4_,(undefined4)local_38.len) == 0) {
    bVar1 = ((fio_str_s_conflict *)(uVar4 + 0x10))->small;
    if ((bVar1 == 0) && (*(long *)(uVar4 + 0x38) != 0)) {
      local_20.len = *(size_t *)(uVar4 + 0x28);
    }
    else {
      local_20.len = (size_t)(bVar1 >> 1);
    }
  }
  else {
    fio_str_write(&local_20,(fio_str_s_conflict *)(uVar4 + 0x10),local_38.data,
                  CONCAT44(local_38.len._4_4_,(undefined4)local_38.len));
  }
  return local_20.len;
}

Assistant:

size_t fiobj_str_concat(FIOBJ dest, FIOBJ obj) {
  assert(FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING));
  if (obj2str(dest)->str.frozen)
    return 0;
  obj2str(dest)->hash = 0;
  fio_str_info_s o = fiobj_obj2cstr(obj);
  if (o.len == 0)
    return fio_str_len(&obj2str(dest)->str);
  return fio_str_write(&obj2str(dest)->str, o.data, o.len).len;
}